

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra-test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_3ac2::OutputRedirectTest_ErrorInDtor_Test::TestBody
          (OutputRedirectTest_ErrorInDtor_Test *this)

{
  file __fd;
  bool bVar1;
  int iVar2;
  OutputRedirect *this_00;
  AssertionResult *pAVar3;
  int __fd2;
  char *pcVar4;
  undefined1 *__s1;
  string_view message;
  file write_end;
  file write_copy;
  file read_end;
  AssertionResult gtest_ar_1;
  buffered_file f;
  string gtest_output;
  AssertionResult gtest_ar;
  scoped_ptr<OutputRedirect> redir;
  OutputRedirect gtest_redir;
  file local_94;
  file local_90;
  file local_8c;
  AssertionResult local_88;
  buffered_file local_78;
  string local_70;
  string local_50;
  scoped_ptr<OutputRedirect> local_30;
  OutputRedirect local_28;
  
  local_8c.fd_ = -1;
  local_94.fd_ = -1;
  fmt::v5::file::pipe(&local_8c,&local_94.fd_);
  __fd.fd_ = local_94.fd_;
  fmt::v5::file::dup(&local_90,local_94.fd_);
  fmt::v5::file::fdopen((file *)&local_78,(int)&local_94,"w");
  this_00 = (OutputRedirect *)operator_new(0x10);
  OutputRedirect::OutputRedirect(this_00,local_78.file_);
  local_88.success_ = true;
  local_30.ptr_ = this_00;
  local_70._M_dataplus._M_p._0_4_ = fputc(0x78,(FILE *)local_78.file_);
  testing::internal::CmpHelperEQ<char,int>
            ((internal *)&local_50,"\'x\'","fputc(\'x\', f.get())",&local_88.success_,
             (int *)&local_70);
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
               ,399,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if (CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                       (int)local_70._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_50._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_88.success_ == true) {
    message.size_ = 0x13;
    message.data_ = "cannot flush stream";
    format_system_error_abi_cxx11_(&local_50,9,message);
    OutputRedirect::OutputRedirect(&local_28,_stderr);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      close(__fd.fd_);
      testing::internal::scoped_ptr<OutputRedirect>::reset(&local_30,(OutputRedirect *)0x0);
    }
    OutputRedirect::restore_and_read_abi_cxx11_(&local_70,&local_28);
    if (local_70._M_string_length == local_50._M_string_length) {
      bVar1 = true;
      __s1 = (undefined1 *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p);
      if ((undefined8 *)local_70._M_string_length != (undefined8 *)0x0) {
        iVar2 = bcmp(__s1,(void *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                           (char)local_50._M_dataplus._M_p),
                     local_70._M_string_length);
        if (iVar2 != 0) goto LAB_00116c15;
      }
    }
    else {
LAB_00116c15:
      pAVar3 = testing::AssertionResult::operator<<
                         (&local_88,
                          (char (*) [71])
                          "{ close(write_fd); redir.reset(nullptr); } produces different output.\n")
      ;
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x164425);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,&local_50);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [2])0x164b12);
      pAVar3 = testing::AssertionResult::operator<<(pAVar3,(char (*) [11])0x164419);
      testing::AssertionResult::operator<<(pAVar3,&local_70);
      __s1 = (undefined1 *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p);
      bVar1 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s1 != &local_70.field_2) {
      operator_delete(__s1);
    }
    OutputRedirect::~OutputRedirect(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p));
    }
    if (bVar1) goto LAB_00116d22;
  }
  testing::Message::Message((Message *)&local_50);
  if (local_88.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar4 = "";
  }
  else {
    pcVar4 = ((local_88.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest-extra-test.cc"
             ,0x197,pcVar4);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&local_50);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
  if (CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((long *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
        (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p
                                    ) + 8))();
    }
  }
LAB_00116d22:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  fmt::v5::file::dup2(&local_90,__fd.fd_,__fd2);
  testing::internal::scoped_ptr<OutputRedirect>::reset(&local_30,(OutputRedirect *)0x0);
  fmt::v5::buffered_file::~buffered_file(&local_78);
  fmt::v5::file::~file(&local_90);
  fmt::v5::file::~file(&local_94);
  fmt::v5::file::~file(&local_8c);
  return;
}

Assistant:

TEST(OutputRedirectTest, ErrorInDtor) {
  file read_end, write_end;
  file::pipe(read_end, write_end);
  int write_fd = write_end.descriptor();
  file write_copy = write_end.dup(write_fd);
  buffered_file f = write_end.fdopen("w");
  scoped_ptr<OutputRedirect> redir(new OutputRedirect(f.get()));
  // Put a character in a file buffer.
  EXPECT_EQ('x', fputc('x', f.get()));
  EXPECT_WRITE(stderr, {
      // The close function must be called inside EXPECT_WRITE, otherwise
      // the system may recycle closed file descriptor when redirecting the
      // output in EXPECT_STDERR and the second close will break output
      // redirection.
      FMT_POSIX(close(write_fd));
      SUPPRESS_ASSERT(redir.reset(FMT_NULL));
  }, format_system_error(EBADF, "cannot flush stream"));
  write_copy.dup2(write_fd); // "undo" close or dtor of buffered_file will fail
}